

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O2

void do_cmd_view_map(void)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  void *p;
  level_conflict *plVar7;
  level_conflict *plVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  char cVar13;
  ulong uVar14;
  ui_event uVar15;
  wchar_t hgt;
  wchar_t wid;
  long local_70;
  level_conflict *local_68;
  level_conflict *local_60;
  level_conflict *local_58;
  level_conflict *local_50;
  ulong local_48;
  ulong local_40;
  wchar_t cx;
  wchar_t cy;
  
  Term_get_size(&wid,&hgt);
  screen_save();
  prt("Please wait...",L'\0',L'\0');
  Term_fresh();
  Term_clear();
  uVar2 = tile_width;
  uVar1 = tile_height;
  tile_width = '\x01';
  tile_height = '\x01';
  display_map(&cy,&cx);
  put_str("Hit any key to continue",Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xfffffff5');
  Term_gotoxy(cx,cy);
  anykey();
  pcVar9 = world->name;
  tile_height = uVar1;
  tile_width = uVar2;
  iVar3 = strcmp(pcVar9,"Hybrid Dungeon");
  if (((iVar3 != 0) && (iVar3 = strcmp(pcVar9,"Angband Dungeon"), iVar3 != 0)) &&
     (wVar4 = level_topography((int)player->place), wVar4 != L'\a')) {
    iVar3 = (int)player->place;
    do {
      local_70 = (long)iVar3 * 0x50;
LAB_001e4cd5:
      do {
        do {
          lVar10 = local_70;
          plVar8 = world->levels;
          pcVar9 = *(char **)((long)&plVar8->north + local_70);
          if (pcVar9 == (char *)0x0) {
            local_50 = (level_conflict *)0x0;
          }
          else {
            local_50 = level_by_name(world,pcVar9);
          }
          pcVar9 = *(char **)((long)&plVar8->east + lVar10);
          if (pcVar9 == (char *)0x0) {
            local_58 = (level_conflict *)0x0;
          }
          else {
            local_58 = level_by_name(world,pcVar9);
          }
          pcVar9 = *(char **)((long)&plVar8->south + lVar10);
          if (pcVar9 == (char *)0x0) {
            local_60 = (level_conflict *)0x0;
          }
          else {
            local_60 = level_by_name(world,pcVar9);
          }
          pcVar9 = *(char **)((long)&plVar8->west + lVar10);
          if (pcVar9 == (char *)0x0) {
            local_68 = (level_conflict *)0x0;
          }
          else {
            local_68 = level_by_name(world,pcVar9);
          }
          Term_fresh();
          Term_clear();
          p = mem_zalloc(100);
          *(int *)((long)p + 0x30) = iVar3;
          for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
            for (uVar14 = 0; uVar14 != 0x19; uVar14 = uVar14 + 1) {
              lVar10 = (long)*(int *)((long)p + uVar14 * 4);
              if (lVar10 != 0) {
                plVar8 = world->levels;
                uVar6 = (int)uVar14 - 5;
                if (uVar14 < 5) {
                  uVar6 = 0xffffffff;
                }
                cVar13 = (char)(((ushort)uVar14 & 0xff) / 5) * -5 + (char)uVar14;
                if (((-1 < (int)uVar6) && (plVar8[lVar10].north != (char *)0x0)) &&
                   (*(int *)((long)p + (ulong)uVar6 * 4) == 0)) {
                  plVar7 = level_by_name(world,plVar8[lVar10].north);
                  *(int *)((long)p + (ulong)uVar6 * 4) = plVar7->index;
                }
                if (((cVar13 != '\x04') && (plVar8[lVar10].east != (char *)0x0)) &&
                   (*(int *)((long)p + uVar14 * 4 + 4) == 0)) {
                  plVar7 = level_by_name(world,plVar8[lVar10].east);
                  *(int *)((long)p + uVar14 * 4 + 4) = plVar7->index;
                }
                if (((uVar14 < 0x14) && (plVar8[lVar10].south != (char *)0x0)) &&
                   (*(int *)((long)p + uVar14 * 4 + 0x14) == 0)) {
                  plVar7 = level_by_name(world,plVar8[lVar10].south);
                  *(int *)((long)p + uVar14 * 4 + 0x14) = plVar7->index;
                }
                uVar6 = -(uint)(cVar13 == '\0') | (int)uVar14 - 1U;
                if (((-1 < (int)uVar6) && (plVar8[lVar10].west != (char *)0x0)) &&
                   (*(int *)((long)p + (ulong)uVar6 * 4) == 0)) {
                  plVar8 = level_by_name(world,plVar8[lVar10].west);
                  *(int *)((long)p + (ulong)uVar6 * 4) = plVar8->index;
                }
              }
            }
          }
          cVar13 = '\0';
          lVar10 = 0;
          while( true ) {
            if (lVar10 == 0x19) break;
            lVar11 = (long)*(int *)((long)p + lVar10 * 4);
            if (lVar11 != 0) {
              bVar12 = cVar13 + (char)(((ushort)lVar10 & 0xff) / 5) * -0x5a;
              local_48 = (ulong)bVar12;
              wVar4 = bVar12 | 1;
              bVar12 = (char)(((ushort)lVar10 & 0xff) / 5) << 2;
              pcVar9 = format("Level %d",(ulong)(uint)world->levels[lVar11].depth);
              print_map_name(*(wchar_t *)((long)p + lVar10 * 4),(uint)bVar12 + L'\x01',wVar4,false);
              uVar14 = local_48;
              uVar1 = '\b';
              if (lVar10 == 0xc) {
                uVar1 = '\x01';
              }
              local_40 = (ulong)bVar12;
              c_put_str(uVar1,pcVar9,(uint)bVar12 + L'\x02',wVar4);
              plVar8 = world->levels;
              lVar11 = (long)*(int *)((long)p + lVar10 * 4);
              iVar5 = (int)uVar14;
              if (plVar8[lVar11].east != (char *)0x0) {
                c_put_str('\x01',"   ---",(uint)bVar12 + L'\x02',iVar5 + L'\t');
                plVar8 = world->levels;
                lVar11 = (long)*(int *)((long)p + lVar10 * 4);
              }
              uVar6 = (uint)local_40;
              if ((plVar8[lVar11].down != (char *)0x0) &&
                 ((plVar8 = level_by_name(world,plVar8[lVar11].down),
                  plVar8->topography == TOP_MOUNTAINTOP || (plVar8->locality != LOC_UNDERWORLD)))) {
                print_map_name(plVar8->index,uVar6 | 3,wVar4,true);
              }
              plVar8 = world->levels;
              lVar11 = (long)*(int *)((long)p + lVar10 * 4);
              if (plVar8[lVar11].south != (char *)0x0) {
                c_put_str('\x01',"|",uVar6 + L'\x04',iVar5 + L'\x04');
                plVar8 = world->levels;
                lVar11 = (long)*(int *)((long)p + lVar10 * 4);
              }
              if ((plVar8[lVar11].south != (char *)0x0) && (plVar8[lVar11].down == (char *)0x0)) {
                c_put_str('\x01',"|",uVar6 | 3,iVar5 + L'\x04');
              }
            }
            lVar10 = lVar10 + 1;
            cVar13 = cVar13 + '\x12';
          }
          mem_free(p);
          put_str("Move keys to scroll, other input to continue",hgt + L'\xffffffff',
                  (wid + L'\xffffffd8') / 2);
          uVar15 = inkey_ex();
          switch(uVar15.key.code) {
          case 0x68:
            goto switchD_001e50e6_caseD_81;
          case 0x69:
            goto switchD_001e50e6_default;
          case 0x6a:
switchD_001e50e6_caseD_80:
            plVar8 = local_60;
            break;
          case 0x6b:
switchD_001e50e6_caseD_83:
            plVar8 = local_50;
            if (local_50 != (level_conflict *)0x0) goto LAB_001e5132;
            goto LAB_001e4cd5;
          case 0x6c:
switchD_001e50e6_caseD_82:
            plVar8 = local_58;
            break;
          default:
            switch(uVar15.key.code) {
            case 0x80:
              goto switchD_001e50e6_caseD_80;
            case 0x81:
switchD_001e50e6_caseD_81:
              plVar8 = local_68;
              break;
            case 0x82:
              goto switchD_001e50e6_caseD_82;
            case 0x83:
              goto switchD_001e50e6_caseD_83;
            default:
              goto switchD_001e50e6_default;
            }
          }
        } while (plVar8 == (level_conflict *)0x0);
LAB_001e5132:
        iVar5 = plVar8->index;
      } while (iVar5 == 0);
      iVar3 = iVar5;
    } while (iVar5 != -1);
  }
switchD_001e50e6_default:
  screen_load();
  return;
}

Assistant:

void do_cmd_view_map(void)
{
	int cy, cx;
	uint8_t w, h;
	const char *prompt = "Hit any key to continue";
	/* variables for regional map */
	int wid, hgt;
	int num_down, num_across, num, centre_place, next_place;
	ui_event ke;

	//if (Term->view_map_hook) {
	//	(*(Term->view_map_hook))(Term);
	//	return;
	//}

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Get dimensions for the regional map */
	num_down = (hgt - 6) / 8;
	num_across = (wid - 24) / 20;
	num = (num_down < num_across ? num_down : num_across);

	/* Hack - limit range for now */
	num = 2;

	/* Save screen */
	screen_save();

	/* Note */
	prt("Please wait...", 0, 0);

	/* Flush */
	Term_fresh();

	/* Clear the screen */
	Term_clear();

	/* store the tile multipliers */
	w = tile_width;
	h = tile_height;
	tile_width = 1;
	tile_height = 1;

	/* Display the map */
	display_map(&cy, &cx);

	/* Show the prompt */
	put_str(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	/* Highlight the player */
	Term_gotoxy(cx, cy);

	/* Get any key */
	(void)anykey();

	/* Restore the tile multipliers */
	tile_width = w;
	tile_height = h;

	/* Show regional map only if there is wilderness */
	if (!streq(world->name, "Hybrid Dungeon") &&
		!streq(world->name, "Angband Dungeon") &&
		(level_topography(player->place) != TOP_CAVE)) {
		centre_place = player->place;
		while (true) {
			/* Get the adjacent levels */
			struct level *lev = &world->levels[centre_place];
			struct level *north = NULL;
			struct level *east = NULL;
			struct level *south = NULL;
			struct level *west = NULL;
			if (lev->north) north = level_by_name(world, lev->north);
			if (lev->east) east = level_by_name(world, lev->east);
			if (lev->south) south = level_by_name(world, lev->south);
			if (lev->west) west = level_by_name(world, lev->west);

			/* Flush */
			Term_fresh();

			/* Clear the screen */
			Term_clear();

			/* Display the regional map */
			regional_map(num, centre_place);

			/* Wait for it */
			put_str("Move keys to scroll, other input to continue",
					hgt - 1, (wid - 40) / 2);

			/* Get any key */
			ke = inkey_ex();
			next_place = -1;
			switch (ke.key.code) {
			case 'k':
			case ARROW_UP:
				next_place = north ? north->index : 0;
				break;
			case 'j':
			case ARROW_DOWN:
				next_place = south ? south->index : 0;
				break;
			case 'h':
			case ARROW_LEFT:
				next_place = west ? west->index : 0;
				break;
			case 'l':
			case ARROW_RIGHT:
				next_place = east ? east->index : 0;
				break;
			}
			if (next_place == -1)
				break;
			if (next_place)
				centre_place = next_place;
		}
	}

	/* Load screen */
	screen_load();
}